

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint32_t __thiscall
booster::locale::util::base_converter::to_unicode(base_converter *this,char **begin,char *end)

{
  byte bVar1;
  uchar cp;
  char *end_local;
  char **begin_local;
  base_converter *this_local;
  uint local_4;
  
  if (*begin == end) {
    local_4 = 0xfffffffe;
  }
  else {
    bVar1 = **begin;
    if (bVar1 < 0x80) {
      *begin = *begin + 1;
      local_4 = (uint)bVar1;
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  return local_4;
}

Assistant:

virtual uint32_t to_unicode(char const *&begin,char const *end) 
        {
            if(begin == end)
                return incomplete;
            unsigned char cp = *begin;
            if(cp <= 0x7F) {
                begin++;
                return cp;
            }
            return illegal;
        }